

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

PropertyQueryFlags __thiscall
Js::TypedArrayBase::GetPropertyQuery
          (TypedArrayBase *this,Var originalInstance,JavascriptString *propertyNameString,Var *value
          ,PropertyValueInfo *info,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  charcount_t length;
  BOOL BVar3;
  PropertyQueryFlags PVar4;
  char16 *str;
  undefined4 *puVar5;
  double local_48;
  double result;
  Var local_38;
  
  result = (double)info;
  local_38 = originalInstance;
  str = JavascriptString::GetString(propertyNameString);
  length = JavascriptString::GetLength(propertyNameString);
  bVar2 = PropertyRecord::IsPropertyNameNumeric(str,length);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x221,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord*"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  BVar3 = JavascriptConversion::CanonicalNumericIndexString
                    (propertyNameString,&local_48,requestContext);
  if (BVar3 == 0) {
    PVar4 = DynamicObject::GetPropertyQuery
                      ((DynamicObject *)this,local_38,propertyNameString,value,
                       (PropertyValueInfo *)result,requestContext);
  }
  else {
    *value = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    PVar4 = Property_NotFound_NoProto;
  }
  return PVar4;
}

Assistant:

PropertyQueryFlags TypedArrayBase::GetPropertyQuery(Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord*");

        if (CanonicalNumericIndexString(propertyNameString, requestContext))
        {
            *value = requestContext->GetLibrary()->GetUndefined();
            return PropertyQueryFlags::Property_NotFound_NoProto;
        }

        return DynamicObject::GetPropertyQuery(originalInstance, propertyNameString, value, info, requestContext);
    }